

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* onmt::split_string(string *str,string *separator,bool skip_empty)

{
  long lVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  ulong uVar2;
  ulong uVar3;
  byte in_CL;
  ulong in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t length;
  size_t index;
  size_t offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3ce492);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::string::size();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    uVar4 = 0;
    do {
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::find(in_RSI,in_RDX);
      if (this == (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0xffffffffffffffff) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,in_RDI,(unsigned_long *)in_stack_ffffffffffffffa0);
        return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00;
      }
      if (((in_CL & 1) == 0) ||
         (in_stack_ffffffffffffffa0 = this,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)this - uVar4)
         != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&,unsigned_long_const&>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)this - uVar4),(unsigned_long *)this_00,(unsigned_long *)in_RDI);
        in_stack_ffffffffffffffa0 = this;
      }
      lVar1 = std::__cxx11::string::size();
      uVar2 = (long)&(in_stack_ffffffffffffffa0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar1;
      uVar4 = uVar2;
      uVar3 = std::__cxx11::string::size();
    } while (uVar2 < uVar3);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::string> split_string(const std::string& str,
                                        const std::string& separator,
                                        bool skip_empty)
  {
    std::vector<std::string> parts;
    if (str.size() == 0)
      return parts;

    parts.reserve(str.size() / 2);

    size_t offset = 0;
    do {
      const size_t index = str.find(separator, offset);
      if (index == std::string::npos) {
        parts.emplace_back(str, offset);
        break;
      }

      const size_t length = index - offset;
      if (!skip_empty || length > 0)
        parts.emplace_back(str, offset, length);
      offset = index + separator.size();
    } while (offset < str.size());

    return parts;
  }